

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall vkt::sr::ShaderRenderCaseInstance::setup(ShaderRenderCaseInstance *this)

{
  PtrData<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_> data;
  PtrData<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_> data_00;
  PtrData<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>
  data_01;
  DescriptorSetLayoutBuilder *this_00;
  MovePtr *this_01;
  DescriptorSetUpdateBuilder *this_02;
  DescriptorSetLayoutBuilder *in_stack_fffffffffffffee8;
  DescriptorSetUpdateBuilder *__return_storage_ptr__;
  undefined8 in_stack_fffffffffffffef0;
  DefaultDeleter<vk::DescriptorSetUpdateBuilder> local_b9;
  undefined1 local_b8 [40];
  PtrData<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_> local_90;
  pointer local_80;
  DefaultDeleter<vk::DescriptorSetLayoutBuilder> local_69;
  PtrData<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
  local_68;
  PtrData<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
  *local_58;
  TextureLevel local_38;
  ShaderRenderCaseInstance *local_10;
  ShaderRenderCaseInstance *this_local;
  
  local_10 = this;
  tcu::TextureLevel::TextureLevel(&local_38);
  tcu::TextureLevel::operator=(&this->m_resultImage,&local_38);
  tcu::TextureLevel::~TextureLevel(&local_38);
  this_00 = (DescriptorSetLayoutBuilder *)operator_new(0x48);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(this_00);
  de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>::DefaultDeleter(&local_69);
  de::details::
  MovePtr<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>::
  MovePtr();
  local_58 = de::details::MovePtr::operator_cast_to_PtrData(&local_68,(MovePtr *)this_00);
  data._8_8_ = in_stack_fffffffffffffef0;
  data.ptr = in_stack_fffffffffffffee8;
  de::details::
  MovePtr<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>::
  operator=(&this->m_descriptorSetLayoutBuilder,data);
  de::details::
  MovePtr<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>::
  ~MovePtr((MovePtr<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
            *)&local_68);
  this_01 = (MovePtr *)operator_new(0x18);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)this_01);
  de::DefaultDeleter<vk::DescriptorPoolBuilder>::DefaultDeleter
            ((DefaultDeleter<vk::DescriptorPoolBuilder> *)(local_b8 + 0x27));
  de::details::MovePtr<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>::
  MovePtr();
  local_80 = (pointer)de::details::MovePtr::operator_cast_to_PtrData(&local_90,this_01);
  data_00._8_8_ = in_stack_fffffffffffffef0;
  data_00.ptr = (DescriptorPoolBuilder *)in_stack_fffffffffffffee8;
  de::details::MovePtr<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>::
  operator=(&this->m_descriptorPoolBuilder,data_00);
  de::details::MovePtr<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>::
  ~MovePtr((MovePtr<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_> *)
           &local_90);
  this_02 = (DescriptorSetUpdateBuilder *)operator_new(0x48);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(this_02);
  de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>::DefaultDeleter(&local_b9);
  __return_storage_ptr__ = (DescriptorSetUpdateBuilder *)local_b8;
  de::details::
  MovePtr<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>::
  MovePtr();
  local_b8._16_8_ =
       de::details::MovePtr::operator_cast_to_PtrData
                 ((PtrData<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>
                   *)__return_storage_ptr__,(MovePtr *)this_02);
  data_01._8_8_ = local_b8._16_8_;
  data_01.ptr = __return_storage_ptr__;
  de::details::
  MovePtr<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>::
  operator=(&this->m_descriptorSetUpdateBuilder,data_01);
  de::details::
  MovePtr<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>::
  ~MovePtr((MovePtr<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>
            *)local_b8);
  std::
  vector<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>_>_>
  ::clear(&this->m_uniformInfos);
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::clear(&this->m_vertexBindingDescription);
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::clear(&this->m_vertexAttributeDescription);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::clear(&this->m_vertexBuffers);
  std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::clear
            (&this->m_vertexBufferAllocs);
  std::vector<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>::clear
            (&this->m_pushConstantRanges);
  return;
}

Assistant:

void ShaderRenderCaseInstance::setup (void)
{
	m_resultImage					= tcu::TextureLevel();
	m_descriptorSetLayoutBuilder	= de::MovePtr<DescriptorSetLayoutBuilder>	(new DescriptorSetLayoutBuilder());
	m_descriptorPoolBuilder			= de::MovePtr<DescriptorPoolBuilder>		(new DescriptorPoolBuilder());
	m_descriptorSetUpdateBuilder	= de::MovePtr<DescriptorSetUpdateBuilder>	(new DescriptorSetUpdateBuilder());

	m_uniformInfos.clear();
	m_vertexBindingDescription.clear();
	m_vertexAttributeDescription.clear();
	m_vertexBuffers.clear();
	m_vertexBufferAllocs.clear();
	m_pushConstantRanges.clear();
}